

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPack.c
# Opt level: O2

Vec_Int_t * Gia_ManLutCollect(Gia_Man_t *p)

{
  uint nCap;
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pObj;
  int *piVar4;
  Vec_Int_t *p_02;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint nSize;
  ulong uVar8;
  
  p_00 = Vec_IntAlloc(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs);
  for (iVar5 = 1; iVar5 < p->nObjs; iVar5 = iVar5 + 1) {
    iVar1 = Gia_ObjIsLut(p,iVar5);
    if (iVar1 != 0) {
      Vec_IntPush(p_00,iVar5);
    }
  }
  p_01 = Vec_IntStart(p->nObjs);
  for (iVar5 = 0; iVar5 < p->vCos->nSize; iVar5 = iVar5 + 1) {
    pObj = Gia_ManCo(p,iVar5);
    iVar1 = Gia_ObjId(p,pObj);
    Vec_IntWriteEntry(p_01,iVar1 - (*(uint *)pObj & 0x1fffffff),1);
  }
  nCap = p_00->nSize;
  uVar6 = nCap;
  while (0 < (int)uVar6) {
    uVar6 = uVar6 - 1;
    iVar5 = Vec_IntEntry(p_00,uVar6);
    iVar1 = Vec_IntEntry(p_01,iVar5);
    for (lVar7 = 0; iVar2 = Gia_ObjLutSize(p,iVar5), lVar7 < iVar2; lVar7 = lVar7 + 1) {
      piVar4 = Gia_ObjLutFanins(p,iVar5);
      iVar2 = piVar4[lVar7];
      iVar3 = Vec_IntEntry(p_01,iVar2);
      if (iVar3 <= iVar1) {
        Vec_IntWriteEntry(p_01,iVar2,iVar1 + 1);
      }
    }
  }
  uVar6 = 0;
  nSize = 0;
  if (0 < (int)nCap) {
    nSize = nCap;
  }
  for (; nSize != uVar6; uVar6 = uVar6 + 1) {
    iVar5 = Vec_IntEntry(p_00,uVar6);
    iVar5 = Vec_IntEntry(p_01,iVar5);
    Vec_IntWriteEntry(p_01,uVar6,-iVar5);
  }
  if (p_01->nSize < (int)nSize) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  p_01->nSize = nSize;
  piVar4 = Abc_MergeSortCost(p_01->pArray,nSize);
  p_02 = Vec_IntAlloc(nCap);
  for (uVar8 = 0; nSize != uVar8; uVar8 = uVar8 + 1) {
    iVar5 = Vec_IntEntry(p_00,piVar4[uVar8]);
    Vec_IntPush(p_02,iVar5);
  }
  Vec_IntFree(p_01);
  Vec_IntFree(p_00);
  free(piVar4);
  return p_02;
}

Assistant:

Vec_Int_t * Gia_ManLutCollect( Gia_Man_t * p )
{
    Vec_Int_t * vLuts, * vDist, * vOrder;
    int i, k, Id, iFan, * pPerm;
    // collect LUTs
    vLuts = Vec_IntAlloc( Gia_ManAndNum(p) );
    Gia_ManForEachLut( p, Id )
        Vec_IntPush( vLuts, Id );
    // propagate distance
    vDist = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManForEachCoDriverId( p, Id, i )
        Vec_IntWriteEntry( vDist, Id, 1 );
    Vec_IntForEachEntryReverse( vLuts, Id, i )
    {
        int Dist = 1 + Vec_IntEntry(vDist, Id);
        Gia_LutForEachFanin( p, Id, iFan, k )
            Vec_IntUpdateEntry( vDist, iFan, Dist );
    }
    // sort LUTs by distance
    k = 0;
    Vec_IntForEachEntry( vLuts, Id, i )
        Vec_IntWriteEntry( vDist, k++, -Vec_IntEntry(vDist, Id) );
    Vec_IntShrink( vDist, k );
    pPerm = Abc_MergeSortCost( Vec_IntArray(vDist), Vec_IntSize(vDist) );
    // collect
    vOrder = Vec_IntAlloc( Vec_IntSize(vLuts) );
    for ( i = 0; i < Vec_IntSize(vLuts); i++ )
        Vec_IntPush( vOrder, Vec_IntEntry(vLuts, pPerm[i]) );
    Vec_IntFree( vDist );
    Vec_IntFree( vLuts );
    ABC_FREE( pPerm );
    return vOrder;
}